

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  ImGuiContext *pIVar2;
  ImVec4 IVar3;
  ImGuiColorMod local_2c;
  
  pIVar2 = GImGui;
  pIVar1 = (GImGui->Style).Colors + idx;
  local_2c.BackupValue.x = pIVar1->x;
  local_2c.BackupValue.y = pIVar1->y;
  local_2c.BackupValue.z = pIVar1->z;
  local_2c.BackupValue.w = pIVar1->w;
  local_2c.Col = idx;
  ImVector<ImGuiColorMod>::push_back(&GImGui->ColorModifiers,&local_2c);
  IVar3 = ColorConvertU32ToFloat4(col);
  (pIVar2->Style).Colors[idx] = IVar3;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}